

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::csharp::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  undefined1 uVar1;
  bool bVar2;
  Syntax SVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  ulong uVar7;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output_00;
  undefined1 local_1e8 [8];
  Printer printer;
  scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> output;
  string local_138;
  undefined1 local_118 [8];
  string filename;
  undefined1 local_f0 [8];
  string filename_error;
  int local_ac;
  undefined1 local_a8 [4];
  int i;
  Options cli_options;
  undefined1 local_50 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)error;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_50);
  ParseGeneratorParameter
            (parameter,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  SVar3 = FileDescriptor::syntax(file);
  if ((SVar3 == SYNTAX_PROTO3) || (bVar2 = IsDescriptorProto(file), bVar2)) {
    Options::Options((Options *)local_a8);
    for (local_ac = 0;
        sVar5 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_50), (ulong)(long)local_ac < sVar5; local_ac = local_ac + 1) {
      pvVar6 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_50,(long)local_ac);
      bVar2 = std::operator==(&pvVar6->first,"file_extension");
      if (bVar2) {
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_50,(long)local_ac);
        std::__cxx11::string::operator=((string *)local_a8,(string *)&pvVar6->second);
      }
      else {
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_50,(long)local_ac);
        bVar2 = std::operator==(&pvVar6->first,"base_namespace");
        if (bVar2) {
          pvVar6 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_50,(long)local_ac);
          std::__cxx11::string::operator=
                    ((string *)(cli_options.file_extension.field_2._M_local_buf + 8),
                     (string *)&pvVar6->second);
          cli_options.base_namespace.field_2._M_local_buf[8] = '\x01';
        }
        else {
          pvVar6 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_50,(long)local_ac);
          bVar2 = std::operator==(&pvVar6->first,"internal_access");
          if (!bVar2) {
            pvVar6 = std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_50,(long)local_ac);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&filename_error.field_2 + 8),"Unknown generator option: ",
                           &pvVar6->first);
            std::__cxx11::string::operator=
                      ((string *)
                       options.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)(filename_error.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(filename_error.field_2._M_local_buf + 8));
            this_local._7_1_ = false;
            cli_options.base_namespace_specified = true;
            cli_options.internal_access = false;
            cli_options._66_2_ = 0;
            goto LAB_0037c9ea;
          }
          cli_options.base_namespace.field_2._M_local_buf[9] = '\x01';
        }
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,"",(allocator<char> *)(filename.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&local_138,(string *)local_a8);
    uVar1 = cli_options.base_namespace.field_2._M_local_buf[8];
    std::__cxx11::string::string
              ((string *)&output,(string *)(cli_options.file_extension.field_2._M_local_buf + 8));
    GetOutputFile((string *)local_118,file,&local_138,(bool)(uVar1 & 1),(string *)&output,
                  (string *)local_f0);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::string::~string((string *)&local_138);
    uVar7 = std::__cxx11::string::empty();
    bVar2 = (uVar7 & 1) != 0;
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)
                 options.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_f0);
      cli_options.base_namespace_specified = true;
      cli_options.internal_access = false;
      cli_options._66_2_ = 0;
    }
    else {
      iVar4 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,local_118);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::scoped_ptr
                ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                 &printer.annotation_collector_,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4)
                );
      output_00 = internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::get
                            ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                             &printer.annotation_collector_);
      io::Printer::Printer((Printer *)local_1e8,output_00,'$');
      GenerateFile(file,(Printer *)local_1e8,(Options *)local_a8);
      cli_options.base_namespace_specified = true;
      cli_options.internal_access = false;
      cli_options._66_2_ = 0;
      io::Printer::~Printer((Printer *)local_1e8);
      internal::scoped_ptr<google::protobuf::io::ZeroCopyOutputStream>::~scoped_ptr
                ((scoped_ptr<google::protobuf::io::ZeroCopyOutputStream> *)
                 &printer.annotation_collector_);
    }
    this_local._7_1_ = !bVar2;
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_f0);
LAB_0037c9ea:
    Options::~Options((Options *)local_a8);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)
               options.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               "C# code generation only supports proto3 syntax");
    this_local._7_1_ = false;
    cli_options.base_namespace_specified = true;
    cli_options.internal_access = false;
    cli_options._66_2_ = 0;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_50);
  return this_local._7_1_;
}

Assistant:

bool Generator::Generate(
    const FileDescriptor* file,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {

  vector<pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);

  // We only support proto3 - but we make an exception for descriptor.proto.
  if (file->syntax() != FileDescriptor::SYNTAX_PROTO3 && !IsDescriptorProto(file)) {
    *error = "C# code generation only supports proto3 syntax";
    return false;
  }

  struct Options cli_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "file_extension") {
      cli_options.file_extension = options[i].second;
    } else if (options[i].first == "base_namespace") {
      cli_options.base_namespace = options[i].second;
      cli_options.base_namespace_specified = true;
    } else if (options[i].first == "internal_access") {
      cli_options.internal_access = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  string filename_error = "";
  std::string filename = GetOutputFile(file,
      cli_options.file_extension,
      cli_options.base_namespace_specified,
      cli_options.base_namespace,
      &filename_error);

  if (filename.empty()) {
    *error = filename_error;
    return false;
  }
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '$');

  GenerateFile(file, &printer, &cli_options);

  return true;
}